

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonlinear_beamformer.cc
# Opt level: O1

void __thiscall webrtc::NonlinearBeamformer::ApplyMaskFrequencySmoothing(NonlinearBeamformer *this)

{
  float *__dest;
  ulong uVar1;
  size_t sVar2;
  bool bVar3;
  float fVar4;
  
  __dest = this->final_mask_;
  memcpy(__dest,this->time_smooth_mask_,0x204);
  uVar1 = this->low_mean_start_bin_;
  if (uVar1 < 0x81) {
    fVar4 = this->final_mask_[uVar1 - 1];
    do {
      fVar4 = fVar4 * 0.39999998 + __dest[uVar1] * 0.6;
      __dest[uVar1] = fVar4;
      uVar1 = uVar1 + 1;
    } while (uVar1 != 0x81);
  }
  sVar2 = this->high_mean_end_bin_;
  if (sVar2 != 0xffffffffffffffff) {
    fVar4 = this->final_mask_[sVar2 + 1];
    do {
      fVar4 = fVar4 * 0.39999998 + __dest[sVar2] * 0.6;
      __dest[sVar2] = fVar4;
      bVar3 = sVar2 != 0;
      sVar2 = sVar2 - 1;
    } while (bVar3);
  }
  return;
}

Assistant:

void NonlinearBeamformer::ApplyMaskFrequencySmoothing() {
  // Smooth over frequency in both directions. The "frequency correction"
  // regions have constant value, but we enter them to smooth over the jump
  // that exists at the boundary. However, this does mean when smoothing "away"
  // from the region that we only need to use the last element.
  //
  // Upward smoothing:
  //   low_mean_start_bin_
  //         v
  // |------|------------|------|
  //       ^------------------>^
  //
  // Downward smoothing:
  //         high_mean_end_bin_
  //                    v
  // |------|------------|------|
  //  ^<------------------^
  std::copy(time_smooth_mask_, time_smooth_mask_ + kNumFreqBins, final_mask_);
  for (size_t i = low_mean_start_bin_; i < kNumFreqBins; ++i) {
    final_mask_[i] = kMaskFrequencySmoothAlpha * final_mask_[i] +
                     (1 - kMaskFrequencySmoothAlpha) * final_mask_[i - 1];
  }
  for (size_t i = high_mean_end_bin_ + 1; i > 0; --i) {
    final_mask_[i - 1] = kMaskFrequencySmoothAlpha * final_mask_[i - 1] +
                         (1 - kMaskFrequencySmoothAlpha) * final_mask_[i];
  }
}